

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float fVar1;
  float fVar2;
  double dVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiTableColumnIdx IVar8;
  int iVar9;
  uint uVar10;
  ImU32 IVar11;
  ImGuiWindow *outer_window_00;
  float *pfVar12;
  char *pcVar13;
  ImGuiTableColumn *pIVar14;
  bool bVar15;
  float fVar16;
  ImRect IVar17;
  float local_2a4;
  ImRect *local_2a0;
  float local_298;
  float local_290;
  float local_28c;
  float local_288;
  float local_280;
  bool local_27a;
  bool local_279;
  float local_264;
  float local_25c;
  int local_23c;
  float local_22c;
  int local_220;
  int n_1;
  float scale_factor;
  float new_ref_scale_unit;
  float local_1ac;
  ImGuiTableColumn *pIStack_1a8;
  float width_auto;
  ImGuiTableColumn *column;
  int n;
  int old_columns_count;
  void *old_columns_raw_data;
  ImGuiTableColumn *old_columns_to_preserve;
  float local_180;
  float local_17c;
  float outer_padding_explicit;
  float outer_padding_for_border;
  float inner_padding_explicit;
  float inner_spacing_explicit;
  float inner_spacing_for_border;
  bool pad_inner_x;
  bool pad_outer_x;
  ImGuiWindow *local_160;
  ImGuiWindow *inner_window;
  ImVec2 local_14c;
  ImVec2 local_144;
  uint local_13c;
  ImGuiWindowFlags child_flags;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 override_content_size;
  ImGuiTableTempData *temp_data;
  ImGuiTableTempData local_108;
  ImPoolIdx local_98;
  uint local_94;
  int table_idx;
  ImGuiTableFlags table_last_flags;
  ImGuiID instance_id;
  int instance_no;
  ImGuiTable *table;
  undefined1 local_74 [8];
  ImRect outer_rect;
  ImVec2 local_5c;
  ImVec2 actual_outer_size;
  ImVec2 avail_size;
  bool use_child_window;
  ImGuiWindow *outer_window;
  ImGuiContext *g;
  float inner_width_local;
  ImVec2 *outer_size_local;
  ImGuiTableFlags flags_local;
  int columns_count_local;
  ImGuiID id_local;
  char *name_local;
  
  pIVar6 = GImGui;
  outer_window_00 = GetCurrentWindow();
  if ((outer_window_00->SkipItems & 1U) == 0) {
    bVar15 = false;
    if ((0 < columns_count) && (bVar15 = false, columns_count < 0x41)) {
      bVar15 = true;
    }
    if (!bVar15) {
      __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                    ,0x13e,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    if (((flags & 0x1000000U) != 0) && (inner_width < 0.0)) {
      __assert_fail("inner_width >= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                    ,0x140,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    bVar15 = (flags & 0x3000000U) == 0;
    actual_outer_size = GetContentRegionAvail();
    outer_rect.Max = *outer_size;
    fVar16 = ImMax<float>(actual_outer_size.x,1.0);
    if (bVar15) {
      local_22c = 0.0;
    }
    else {
      local_22c = ImMax<float>(actual_outer_size.y,1.0);
    }
    local_5c = CalcItemSize(outer_rect.Max,fVar16,local_22c);
    unique0x10000250 = operator+(&(outer_window_00->DC).CursorPos,&local_5c);
    ImRect::ImRect((ImRect *)local_74,&(outer_window_00->DC).CursorPos,(ImVec2 *)((long)&table + 4))
    ;
    if ((bVar15) || (bVar7 = IsClippedEx((ImRect *)local_74,0), !bVar7)) {
      _instance_id = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar6->Tables,id);
      if (_instance_id->LastFrameActive == pIVar6->FrameCount) {
        local_23c = _instance_id->InstanceCurrent + 1;
      }
      else {
        local_23c = 0;
      }
      table_last_flags = local_23c;
      table_idx = id + local_23c;
      local_94 = _instance_id->Flags;
      if ((0 < local_23c) && (_instance_id->ColumnsCount != columns_count)) {
        __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                      ,0x153,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
      local_98 = ImPool<ImGuiTable>::GetIndex(&pIVar6->Tables,_instance_id);
      iVar9 = pIVar6->TablesTempDataStacked + 1;
      pIVar6->TablesTempDataStacked = iVar9;
      if ((pIVar6->TablesTempData).Size < iVar9) {
        iVar9 = pIVar6->TablesTempDataStacked;
        ImGuiTableTempData::ImGuiTableTempData(&local_108);
        ImVector<ImGuiTableTempData>::resize(&pIVar6->TablesTempData,iVar9,&local_108);
        ImGuiTableTempData::~ImGuiTableTempData(&local_108);
      }
      override_content_size =
           (ImVec2)ImVector<ImGuiTableTempData>::operator[]
                             (&pIVar6->TablesTempData,pIVar6->TablesTempDataStacked + -1);
      _instance_id->TempData = (ImGuiTableTempData *)override_content_size;
      *(ImPoolIdx *)override_content_size = local_98;
      _instance_id->DrawSplitter = &_instance_id->TempData->DrawSplitter;
      ImDrawListSplitter::Clear(_instance_id->DrawSplitter);
      _instance_id->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
      uVar10 = TableFixFlags(flags,outer_window_00);
      _instance_id->ID = id;
      _instance_id->Flags = uVar10;
      _instance_id->InstanceCurrent = (ImS16)table_last_flags;
      _instance_id->LastFrameActive = pIVar6->FrameCount;
      _instance_id->InnerWindow = outer_window_00;
      _instance_id->OuterWindow = outer_window_00;
      _instance_id->ColumnsCount = columns_count;
      _instance_id->IsLayoutLocked = false;
      _instance_id->InnerWidth = inner_width;
      *(ImVec2 *)((long)override_content_size + 8) = *outer_size;
      if (bVar15) {
        (_instance_id->InnerRect).Min.x = (float)local_74._0_4_;
        (_instance_id->InnerRect).Min.y = (float)local_74._4_4_;
        (_instance_id->InnerRect).Max = outer_rect.Min;
        (_instance_id->OuterRect).Min = (_instance_id->InnerRect).Min;
        (_instance_id->OuterRect).Max = (_instance_id->InnerRect).Max;
        (_instance_id->WorkRect).Min = (_instance_id->OuterRect).Min;
        (_instance_id->WorkRect).Max = (_instance_id->OuterRect).Max;
      }
      else {
        ImVec2::ImVec2(&local_128,3.4028235e+38,3.4028235e+38);
        if (((uVar10 & 0x1000000) != 0) && ((uVar10 & 0x2000000) == 0)) {
          local_128.y = 1.1754944e-38;
        }
        if (((uVar10 & 0x1000000) != 0) && (0.0 < inner_width)) {
          local_128.x = inner_width;
        }
        if ((((local_128.x != 3.4028235e+38) || (NAN(local_128.x))) ||
            (local_128.y != 3.4028235e+38)) || (NAN(local_128.y))) {
          if ((local_128.x != 3.4028235e+38) || (NAN(local_128.x))) {
            local_25c = local_128.x;
          }
          else {
            local_25c = 0.0;
          }
          if ((local_128.y != 3.4028235e+38) || (NAN(local_128.y))) {
            local_264 = local_128.y;
          }
          else {
            local_264 = 0.0;
          }
          ImVec2::ImVec2(&local_130,local_25c,local_264);
          SetNextWindowContentSize(&local_130);
        }
        if ((local_94 & 0x3000000) == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec8,0.0,0.0);
          SetNextWindowScroll((ImVec2 *)&stack0xfffffffffffffec8);
        }
        iVar9 = table_idx;
        local_13c = (uVar10 & 0x1000000) >> 0xd;
        local_144 = ImRect::GetSize((ImRect *)local_74);
        BeginChildEx(name,iVar9,&local_144,false,local_13c);
        _instance_id->InnerWindow = pIVar6->CurrentWindow;
        IVar5 = (_instance_id->InnerWindow->WorkRect).Max;
        (_instance_id->WorkRect).Min = (_instance_id->InnerWindow->WorkRect).Min;
        (_instance_id->WorkRect).Max = IVar5;
        IVar17 = ImGuiWindow::Rect(_instance_id->InnerWindow);
        local_14c = IVar17.Max;
        unique0x100001f4 = IVar17.Min;
        (_instance_id->OuterRect).Min = unique0x100001f4;
        (_instance_id->OuterRect).Max = local_14c;
        pIVar4 = _instance_id->InnerWindow;
        (_instance_id->InnerRect).Min = (pIVar4->InnerRect).Min;
        (_instance_id->InnerRect).Max = (pIVar4->InnerRect).Max;
        fVar16 = (_instance_id->InnerWindow->WindowPadding).x;
        bVar15 = false;
        if ((fVar16 == 0.0) && (!NAN(fVar16))) {
          fVar16 = (_instance_id->InnerWindow->WindowPadding).y;
          bVar15 = false;
          if ((fVar16 == 0.0) && (!NAN(fVar16))) {
            bVar15 = _instance_id->InnerWindow->WindowBorderSize == 0.0;
          }
        }
        if (!bVar15) {
          __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                        ,0x18b,
                        "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                       );
        }
      }
      PushOverrideID(table_idx);
      local_160 = _instance_id->InnerWindow;
      _instance_id->HostIndentX = (local_160->DC).Indent.x;
      (_instance_id->HostClipRect).Min = (local_160->ClipRect).Min;
      (_instance_id->HostClipRect).Max = (local_160->ClipRect).Max;
      _instance_id->HostSkipItems = (bool)(local_160->SkipItems & 1);
      *(ImVec2 *)((long)override_content_size + 0x28) = (local_160->WorkRect).Min;
      *(ImVec2 *)((long)override_content_size + 0x30) = (local_160->WorkRect).Max;
      *(ImVec2 *)((long)override_content_size + 0x38) = (local_160->ParentWorkRect).Min;
      *(ImVec2 *)((long)override_content_size + 0x40) = (local_160->ParentWorkRect).Max;
      *(float *)((long)override_content_size + 0x60) = (outer_window_00->DC).ColumnsOffset.x;
      *(ImVec2 *)((long)override_content_size + 0x48) = (local_160->DC).PrevLineSize;
      *(ImVec2 *)((long)override_content_size + 0x50) = (local_160->DC).CurrLineSize;
      *(ImVec2 *)((long)override_content_size + 0x58) = (local_160->DC).CursorMaxPos;
      *(float *)((long)override_content_size + 100) = (outer_window_00->DC).ItemWidth;
      *(int *)((long)override_content_size + 0x68) = (outer_window_00->DC).ItemWidthStack.Size;
      ImVec2::ImVec2((ImVec2 *)&inner_spacing_for_border,0.0,0.0);
      (local_160->DC).CurrLineSize = _inner_spacing_for_border;
      (local_160->DC).PrevLineSize = (local_160->DC).CurrLineSize;
      if ((uVar10 & 0x400000) == 0) {
        local_27a = (uVar10 & 0x200000) != 0 || (uVar10 & 0x400) != 0;
        local_279 = local_27a;
      }
      else {
        local_279 = false;
      }
      inner_spacing_explicit._3_1_ = local_279;
      inner_spacing_explicit._2_1_ = -((uVar10 & 0x800000) == 0) & 1;
      local_280 = 1.0;
      if ((uVar10 & 0x200) == 0) {
        local_280 = 0.0;
      }
      inner_padding_explicit = local_280;
      if ((inner_spacing_explicit._2_1_ == 0) || ((uVar10 & 0x200) != 0)) {
        local_288 = 0.0;
      }
      else {
        local_288 = (pIVar6->Style).CellPadding.x;
      }
      outer_padding_for_border = local_288;
      if ((inner_spacing_explicit._2_1_ == 0) || ((uVar10 & 0x200) == 0)) {
        local_28c = 0.0;
      }
      else {
        local_28c = (pIVar6->Style).CellPadding.x;
      }
      outer_padding_explicit = local_28c;
      _instance_id->CellSpacingX1 = local_288 + local_280;
      _instance_id->CellSpacingX2 = local_288;
      _instance_id->CellPaddingX = local_28c;
      _instance_id->CellPaddingY = (pIVar6->Style).CellPadding.y;
      local_290 = 1.0;
      if ((uVar10 & 0x400) == 0) {
        local_290 = 0.0;
      }
      local_17c = local_290;
      if (local_279 == false) {
        local_298 = 0.0;
      }
      else {
        local_298 = (pIVar6->Style).CellPadding.x;
      }
      local_180 = local_298;
      _instance_id->OuterPaddingX = (local_290 + local_298) - _instance_id->CellPaddingX;
      _instance_id->CurrentColumn = -1;
      _instance_id->CurrentRow = -1;
      _instance_id->RowBgColorCounter = 0;
      *(uint *)&_instance_id->field_0x98 = *(uint *)&_instance_id->field_0x98 & 0xffff;
      if (local_160 == outer_window_00) {
        local_2a0 = &_instance_id->WorkRect;
      }
      else {
        local_2a0 = &local_160->ClipRect;
      }
      (_instance_id->InnerClipRect).Min = local_2a0->Min;
      (_instance_id->InnerClipRect).Max = local_2a0->Max;
      ImRect::ClipWith(&_instance_id->InnerClipRect,&_instance_id->WorkRect);
      ImRect::ClipWithFull(&_instance_id->InnerClipRect,&_instance_id->HostClipRect);
      if ((uVar10 & 0x20000) == 0) {
        local_2a4 = (local_160->ClipRect).Max.y;
      }
      else {
        local_2a4 = ImMin<float>((_instance_id->InnerClipRect).Max.y,(local_160->WorkRect).Max.y);
      }
      (_instance_id->InnerClipRect).Max.y = local_2a4;
      fVar16 = (_instance_id->WorkRect).Min.y;
      _instance_id->RowPosY2 = fVar16;
      _instance_id->RowPosY1 = fVar16;
      _instance_id->RowTextBaseline = 0.0;
      _instance_id->FreezeRowsCount = '\0';
      _instance_id->FreezeRowsRequest = '\0';
      _instance_id->FreezeColumnsCount = '\0';
      _instance_id->FreezeColumnsRequest = '\0';
      _instance_id->IsUnfrozenRows = true;
      _instance_id->DeclColumnsCount = '\0';
      IVar11 = GetColorU32(0x2d,1.0);
      _instance_id->BorderColorStrong = IVar11;
      IVar11 = GetColorU32(0x2e,1.0);
      _instance_id->BorderColorLight = IVar11;
      pIVar6->CurrentTable = _instance_id;
      (outer_window_00->DC).CurrentTableIdx = local_98;
      if (local_160 != outer_window_00) {
        (local_160->DC).CurrentTableIdx = local_98;
      }
      if (((local_94 & 2) != 0) && ((uVar10 & 2) == 0)) {
        _instance_id->IsResetDisplayOrderRequest = true;
      }
      if ((pIVar6->TablesLastTimeActive).Size <= local_98) {
        old_columns_to_preserve._4_4_ = 0xbf800000;
        ImVector<float>::resize
                  (&pIVar6->TablesLastTimeActive,local_98 + 1,
                   (float *)((long)&old_columns_to_preserve + 4));
      }
      dVar3 = pIVar6->Time;
      pfVar12 = ImVector<float>::operator[](&pIVar6->TablesLastTimeActive,local_98);
      *pfVar12 = (float)dVar3;
      *(float *)((long)override_content_size + 4) = (float)pIVar6->Time;
      _instance_id->MemoryCompacted = false;
      old_columns_raw_data = (void *)0x0;
      _n = (void *)0x0;
      column._4_4_ = ImSpan<ImGuiTableColumn>::size(&_instance_id->Columns);
      if ((column._4_4_ != 0) && (column._4_4_ != columns_count)) {
        old_columns_raw_data = (_instance_id->Columns).Data;
        _n = _instance_id->RawData;
        _instance_id->RawData = (void *)0x0;
      }
      if (_instance_id->RawData == (void *)0x0) {
        TableBeginInitMemory(_instance_id,columns_count);
        _instance_id->IsSettingsRequestLoad = true;
        _instance_id->IsInitializing = true;
      }
      if ((_instance_id->IsResetAllRequest & 1U) != 0) {
        TableResetSettings(_instance_id);
      }
      if ((_instance_id->IsInitializing & 1U) != 0) {
        _instance_id->SettingsOffset = -1;
        _instance_id->IsSortSpecsDirty = true;
        _instance_id->InstanceInteracted = -1;
        _instance_id->ContextPopupColumn = -1;
        _instance_id->LastResizedColumn = -1;
        _instance_id->ResizedColumn = -1;
        _instance_id->ReorderColumn = -1;
        _instance_id->AutoFitSingleColumn = -1;
        _instance_id->HoveredColumnBorder = -1;
        _instance_id->HoveredColumnBody = -1;
        for (column._0_4_ = 0; (int)column < columns_count; column._0_4_ = (int)column + 1) {
          pIStack_1a8 = ImSpan<ImGuiTableColumn>::operator[](&_instance_id->Columns,(int)column);
          if ((old_columns_raw_data == (void *)0x0) || (column._4_4_ <= (int)column)) {
            local_1ac = pIStack_1a8->WidthAuto;
            ImGuiTableColumn::ImGuiTableColumn((ImGuiTableColumn *)&scale_factor);
            memcpy(pIStack_1a8,&scale_factor,0x67);
            pIStack_1a8->WidthAuto = local_1ac;
            pIStack_1a8->IsPreserveWidthAuto = true;
            pIStack_1a8->IsUserEnabledNextFrame = true;
            pIStack_1a8->IsUserEnabled = true;
            pIStack_1a8->IsEnabled = true;
          }
          else {
            memcpy(pIStack_1a8,(void *)((long)old_columns_raw_data + (long)(int)column * 0x68),0x67)
            ;
          }
          IVar8 = (ImGuiTableColumnIdx)(int)column;
          pcVar13 = ImSpan<signed_char>::operator[](&_instance_id->DisplayOrderToIndex,(int)column);
          *pcVar13 = IVar8;
          pIStack_1a8->DisplayOrder = IVar8;
        }
      }
      if (_n != (void *)0x0) {
        MemFree(_n);
      }
      if ((_instance_id->IsSettingsRequestLoad & 1U) != 0) {
        TableLoadSettings(_instance_id);
      }
      fVar16 = pIVar6->FontSize;
      if (((_instance_id->RefScale != 0.0) || (NAN(_instance_id->RefScale))) &&
         ((_instance_id->RefScale != fVar16 || (NAN(_instance_id->RefScale) || NAN(fVar16))))) {
        fVar1 = _instance_id->RefScale;
        for (local_220 = 0; local_220 < columns_count; local_220 = local_220 + 1) {
          pIVar14 = ImSpan<ImGuiTableColumn>::operator[](&_instance_id->Columns,local_220);
          fVar2 = pIVar14->WidthRequest;
          pIVar14 = ImSpan<ImGuiTableColumn>::operator[](&_instance_id->Columns,local_220);
          pIVar14->WidthRequest = fVar2 * (fVar16 / fVar1);
        }
      }
      _instance_id->RefScale = fVar16;
      local_160->SkipItems = true;
      if (0 < (_instance_id->ColumnsNames).Buf.Size) {
        ImVector<char>::resize(&(_instance_id->ColumnsNames).Buf,0);
      }
      TableBeginApplyRequests(_instance_id);
      name_local._7_1_ = true;
    }
    else {
      ItemSize((ImRect *)local_74,-1.0);
      name_local._7_1_ = false;
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}